

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void proto3_unittest::TestOneof2::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  TestOneof2 **v1;
  TestOneof2 **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestOneof2 *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestOneof2 *from;
  TestOneof2 *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestOneof2 *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestOneof2 *)to_msg;
  _this = (TestOneof2 *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_unittest::TestOneof2_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_unittest::TestOneof2*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_unittest::TestOneof2_const*,proto3_unittest::TestOneof2*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint32_t *)(absl_log_internal_check_op_result + 0x18);
    if (uVar1 != 0) {
      uVar2 = (from->field_0)._impl_._oneof_case_[0];
      if (uVar2 != uVar1) {
        if (uVar2 != 0) {
          clear_foo(from);
        }
        (from->field_0)._impl_._oneof_case_[0] = uVar1;
      }
      if ((uVar1 != 0) && (uVar1 == 6)) {
        (from->field_0)._impl_.foo_ = *(FooUnion *)(absl_log_internal_check_op_result + 0x10);
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
             ,0x15c1,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void TestOneof2::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneof2*>(&to_msg);
  auto& from = static_cast<const TestOneof2&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestOneof2)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_foo();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kFooEnum: {
        _this->_impl_.foo_.foo_enum_ = from._impl_.foo_.foo_enum_;
        break;
      }
      case FOO_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}